

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestInfo * __thiscall testing::TestSuite::GetMutableTestInfo(TestSuite *this,int i)

{
  int iVar1;
  reference ppTVar2;
  value_type local_28;
  int index;
  int i_local;
  TestSuite *this_local;
  
  iVar1 = testing::internal::GetElementOr<int>(&this->test_indices_,i,-1);
  if (iVar1 < 0) {
    local_28 = (value_type)0x0;
  }
  else {
    ppTVar2 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                        (&this->test_info_list_,(long)iVar1);
    local_28 = *ppTVar2;
  }
  return local_28;
}

Assistant:

TestInfo* TestSuite::GetMutableTestInfo(int i) {
  const int index = GetElementOr(test_indices_, i, -1);
  return index < 0 ? nullptr : test_info_list_[static_cast<size_t>(index)];
}